

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void init_op(void)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    *(code **)((long)op + lVar1) = undefined_op;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x800);
  op[0] = unreachable_op;
  op[1] = nop_op;
  op[2] = block_op;
  op[3] = loop_op;
  op[4] = if_op;
  op[5] = nop_op;
  op[0xb] = nop_op;
  op[0xc] = br_op;
  op[0xd] = brIf_op;
  op[0xe] = brTable_op;
  op[0xf] = return_op;
  op[0x10] = call_op;
  op[0x11] = callIndirect_op;
  op[0x1a] = drop_op;
  op[0x1b] = select_op;
  op[0x20] = localGet_op;
  op[0x21] = localSet_op;
  op[0x22] = localTee_op;
  op[0x23] = globalGet_op;
  op[0x24] = globalSet_op;
  op[0x28] = i32Load_op;
  op[0x29] = i64Load_op;
  op[0x2a] = f32Load_op;
  op[0x2b] = f64Load_op;
  op[0x2c] = i32Load8S_op;
  op[0x2d] = i32Load8U_op;
  op[0x2e] = i32Load16S_op;
  op[0x2f] = i32Load16U_op;
  op[0x30] = i64Load8S_op;
  op[0x31] = i64Load8U_op;
  op[0x32] = i64Load16S_op;
  op[0x33] = i64Load16U_op;
  op[0x34] = i64Load32S_op;
  op[0x35] = i64Load32U_op;
  op[0x36] = i32Store_op;
  op[0x37] = i64Store_op;
  op[0x38] = f32Store_op;
  op[0x39] = f64Store_op;
  op[0x3a] = i32Store8_op;
  op[0x3b] = i32Store16_op;
  op[0x3c] = i64Store8_op;
  op[0x3d] = i64Store16_op;
  op[0x3e] = i64Store32_op;
  op[0x3f] = memorySize_op;
  op[0x40] = memoryGrow_op;
  op[0x41] = i32Const_op;
  op[0x42] = i64Const_op;
  op[0x43] = f32Const_op;
  op[0x44] = f64Const_op;
  op[0x45] = i32Eqz_op;
  op[0x46] = i32Eq_op;
  op[0x47] = i32Ne_op;
  op[0x48] = i32Lts_op;
  op[0x49] = i32Ltu_op;
  op[0x4a] = i32Gts_op;
  op[0x4b] = i32Gtu_op;
  op[0x4c] = i32Les_op;
  op[0x4d] = i32Leu_op;
  op[0x4e] = i32Ges_op;
  op[0x4f] = i32Geu_op;
  op[0x50] = i64Eqz_op;
  op[0x51] = i64Eq_op;
  op[0x52] = i64Ne_op;
  op[0x53] = i64Lts_op;
  op[0x54] = i64Ltu_op;
  op[0x55] = i64Gts_op;
  op[0x56] = i64Gtu_op;
  op[0x57] = i64Les_op;
  op[0x58] = i64Leu_op;
  op[0x59] = i64Ges_op;
  op[0x5a] = i64Geu_op;
  op[0x5b] = f32Eq_op;
  op[0x5c] = f32Ne_op;
  op[0x5d] = f32Lt_op;
  op[0x5e] = f32Gt_op;
  op[0x5f] = f32Le_op;
  op[0x60] = f32Ge_op;
  op[0x61] = f64Eq_op;
  op[0x62] = f64Ne_op;
  op[99] = f64Lt_op;
  op[100] = f64Gt_op;
  op[0x65] = f64Le_op;
  op[0x66] = f64Ge_op;
  op[0x67] = i32Clz_op;
  op[0x68] = i32Ctz_op;
  op[0x69] = i32Popcnt_op;
  op[0x6a] = i32Add_op;
  op[0x6b] = i32Sub_op;
  op[0x6c] = i32Mul_op;
  op[0x6d] = i32DivS_op;
  op[0x6e] = i32DivU_op;
  op[0x6f] = i32RemS_op;
  op[0x70] = i32RemU_op;
  op[0x71] = i32And_op;
  op[0x72] = i32Or_op;
  op[0x73] = i32Xor_op;
  op[0x74] = i32Shl_op;
  op[0x75] = i32ShrS_op;
  op[0x76] = i32ShrU_op;
  op[0x77] = i32RotL_op;
  op[0x78] = i32RotR_op;
  op[0x79] = i64Clz_op;
  op[0x7a] = i64Ctz_op;
  op[0x7b] = i64Popcnt_op;
  op[0x7c] = i64Add_op;
  op[0x7d] = i64Sub_op;
  op[0x7e] = i64Mul_op;
  op[0x7f] = i64DivS_op;
  op[0x80] = i64DivU_op;
  op[0x81] = i64RemS_op;
  op[0x82] = i64RemU_op;
  op[0x83] = i64And_op;
  op[0x84] = i64Or_op;
  op[0x85] = i64Xor_op;
  op[0x86] = i64Shl_op;
  op[0x87] = i64ShrS_op;
  op[0x88] = i64ShrU_op;
  op[0x89] = i64RotL_op;
  op[0x8a] = i64RotR_op;
  op[0x8b] = f32Abs_op;
  op[0x8c] = f32Neg_op;
  op[0x8d] = f32Ceil_op;
  op[0x8e] = f32Floor_op;
  op[0x8f] = f32Trunc_op;
  op[0x90] = f32Nearest_op;
  op[0x91] = f32Sqrt_op;
  op[0x92] = f32Add_op;
  op[0x93] = f32Sub_op;
  op[0x94] = f32mul_op;
  op[0x95] = f32Div_op;
  op[0x96] = f32min_op;
  op[0x97] = f32Max_op;
  op[0x98] = f32Copysign_op;
  op[0x99] = f64Abs_op;
  op[0x9a] = f64Neg_op;
  op[0x9b] = f64Ceil_op;
  op[0x9c] = f64Floor_op;
  op[0x9d] = f64Trunc_op;
  op[0x9e] = f64Nearest_op;
  op[0x9f] = f64Sqrt_op;
  op[0xa0] = f64Add_op;
  op[0xa1] = f64Sub_op;
  op[0xa2] = f64mul_op;
  op[0xa3] = f64Div_op;
  op[0xa4] = f64min_op;
  op[0xa5] = f64Max_op;
  op[0xa6] = f64Copysign_op;
  op[0xa7] = i32wrapI64_op;
  op[0xa8] = i32TruncF32S_op;
  op[0xa9] = i32TruncF32U_op;
  op[0xaa] = i32TruncF64S_op;
  op[0xab] = i32TruncF64U_op;
  op[0xac] = i64ExtendI32S_op;
  op[0xad] = i64ExtendI32U_op;
  op[0xae] = i64TruncF32S_op;
  op[0xaf] = i64TruncF32U_op;
  op[0xb0] = i64TruncF64S_op;
  op[0xb1] = i64TruncF64U_op;
  op[0xb2] = f32ConvertI32S_op;
  op[0xb3] = f32ConvertI32U_op;
  op[0xb4] = f32ConvertI64S_op;
  op[0xb5] = f32ConvertI64U_op;
  op[0xb6] = f32DemoteF64_op;
  op[0xb7] = f64ConvertI32S_op;
  op[0xb8] = f64ConvertI32U_op;
  op[0xb9] = f64ConvertI64S_op;
  op[0xba] = f64ConvertI64U_op;
  op[0xbb] = f64PromoteF32_op;
  op[0xbc] = i32ReinterpretF32_op;
  op[0xbd] = i64ReinterpretF64_op;
  op[0xbe] = f32ReinterpretI32_op;
  op[0xbf] = f64ReinterpretI64_op;
  op[0xc0] = i32Extend8S_op;
  op[0xc1] = i32Extend16S_op;
  op[0xc2] = i64Extend8S_op;
  op[0xc3] = i64Extend16S_op;
  op[0xc4] = i64Extend32S_op;
  op[0xfc] = truncSat_op;
  return;
}

Assistant:

void init_op() {
    for (int i = 0; i < 256; ++i) {
        op[i] = undefined_op;
    }
    op[Unreachable] = unreachable_op;
    op[Nop] = nop_op;
    op[Block] = block_op;
    op[Loop] = loop_op;
    op[If] = if_op;
    /*下面两个其实是伪指令*/
    op[Else_] = else_op;
    op[End_] = end_op;
    op[Br] = br_op;
    op[BrIf] = brIf_op;
    op[BrTable] = brTable_op;
    op[Return] = return_op;
    op[Call] = call_op;
    op[CallIndirect] = callIndirect_op;
    op[Drop] = drop_op;
    op[Select] = select_op;
    op[LocalGet] = localGet_op;
    op[LocalSet] = localSet_op;
    op[LocalTee] = localTee_op;
    op[GlobalGet] = globalGet_op;
    op[GlobalSet] = globalSet_op;
    op[I32Load] = i32Load_op;
    op[I64Load] = i64Load_op;
    op[F32Load] = f32Load_op;
    op[F64Load] = f64Load_op;
    op[I32Load8S] = i32Load8S_op;
    op[I32Load8U] = i32Load8U_op;
    op[I32Load16S] = i32Load16S_op;
    op[I32Load16U] = i32Load16U_op;
    op[I64Load8S] = i64Load8S_op;
    op[I64Load8U] = i64Load8U_op;
    op[I64Load16S] = i64Load16S_op;
    op[I64Load16U] = i64Load16U_op;
    op[I64Load32S] = i64Load32S_op;
    op[I64Load32U] = i64Load32U_op;
    op[I32Store] = i32Store_op;
    op[I64Store] = i64Store_op;
    op[F32Store] = f32Store_op;
    op[F64Store] = f64Store_op;
    op[I32Store8] = i32Store8_op;
    op[I32Store16] = i32Store16_op;
    op[I64Store8] = i64Store8_op;
    op[I64Store16] = i64Store16_op;
    op[I64Store32] = i64Store32_op;
    op[MemorySize] = memorySize_op;
    op[MemoryGrow] = memoryGrow_op;
    op[I32Const] = i32Const_op;
    op[I64Const] = i64Const_op;
    op[F32Const] = f32Const_op;
    op[F64Const] = f64Const_op;
    op[I32Eqz] = i32Eqz_op;
    op[I32Eq] = i32Eq_op;
    op[I32Ne] = i32Ne_op;
    op[I32LtS] = i32Lts_op;
    op[I32LtU] = i32Ltu_op;
    op[I32GtS] = i32Gts_op;
    op[I32GtU] = i32Gtu_op;
    op[I32LeS] = i32Les_op;
    op[I32LeU] = i32Leu_op;
    op[I32GeS] = i32Ges_op;
    op[I32GeU] = i32Geu_op;
    op[I64Eqz] = i64Eqz_op;
    op[I64Eq] = i64Eq_op;
    op[I64Ne] = i64Ne_op;
    op[I64LtS] = i64Lts_op;
    op[I64LtU] = i64Ltu_op;
    op[I64GtS] = i64Gts_op;
    op[I64GtU] = i64Gtu_op;
    op[I64LeS] = i64Les_op;
    op[I64LeU] = i64Leu_op;
    op[I64GeS] = i64Ges_op;
    op[I64GeU] = i64Geu_op;
    op[F32Eq] = f32Eq_op;
    op[F32Ne] = f32Ne_op;
    op[F32Lt] = f32Lt_op;
    op[F32Gt] = f32Gt_op;
    op[F32Le] = f32Le_op;
    op[F32Ge] = f32Ge_op;
    op[F64Eq] = f64Eq_op;
    op[F64Ne] = f64Ne_op;
    op[F64Lt] = f64Lt_op;
    op[F64Gt] = f64Gt_op;
    op[F64Le] = f64Le_op;
    op[F64Ge] = f64Ge_op;
    op[I32Clz] = i32Clz_op;
    op[I32Ctz] = i32Ctz_op;
    op[I32PopCnt] = i32Popcnt_op;
    op[I32Add] = i32Add_op;
    op[I32Sub] = i32Sub_op;
    op[I32Mul] = i32Mul_op;
    op[I32DivS] = i32DivS_op;
    op[I32DivU] = i32DivU_op;
    op[I32RemS] = i32RemS_op;
    op[I32RemU] = i32RemU_op;
    op[I32And] = i32And_op;
    op[I32Or] = i32Or_op;
    op[I32Xor] = i32Xor_op;
    op[I32Shl] = i32Shl_op;
    op[I32ShrS] = i32ShrS_op;
    op[I32ShrU] = i32ShrU_op;
    op[I32Rotl] = i32RotL_op;
    op[I32Rotr] = i32RotR_op;
    op[I64Clz] = i64Clz_op;
    op[I64Ctz] = i64Ctz_op;
    op[I64PopCnt] = i64Popcnt_op;
    op[I64Add] = i64Add_op;
    op[I64Sub] = i64Sub_op;
    op[I64Mul] = i64Mul_op;
    op[I64DivS] = i64DivS_op;
    op[I64DivU] = i64DivU_op;
    op[I64RemS] = i64RemS_op;
    op[I64RemU] = i64RemU_op;
    op[I64And] = i64And_op;
    op[I64Or] = i64Or_op;
    op[I64Xor] = i64Xor_op;
    op[I64Shl] = i64Shl_op;
    op[I64ShrS] = i64ShrS_op;
    op[I64ShrU] = i64ShrU_op;
    op[I64Rotl] = i64RotL_op;
    op[I64Rotr] = i64RotR_op;
    op[F32Abs] = f32Abs_op;
    op[F32Neg] = f32Neg_op;
    op[F32Ceil] = f32Ceil_op;
    op[F32Floor] = f32Floor_op;
    op[F32Trunc] = f32Trunc_op;
    op[F32Nearest] = f32Nearest_op;
    op[F32Sqrt] = f32Sqrt_op;
    op[F32Add] = f32Add_op;
    op[F32Sub] = f32Sub_op;
    op[F32Mul] = f32mul_op;
    op[F32Div] = f32Div_op;
    op[F32Min] = f32min_op;
    op[F32Max] = f32Max_op;
    op[F32CopySign] = f32Copysign_op;
    op[F64Abs] = f64Abs_op;
    op[F64Neg] = f64Neg_op;
    op[F64Ceil] = f64Ceil_op;
    op[F64Floor] = f64Floor_op;
    op[F64Trunc] = f64Trunc_op;
    op[F64Nearest] = f64Nearest_op;
    op[F64Sqrt] = f64Sqrt_op;
    op[F64Add] = f64Add_op;
    op[F64Sub] = f64Sub_op;
    op[F64Mul] = f64mul_op;
    op[F64Div] = f64Div_op;
    op[F64Min] = f64min_op;
    op[F64Max] = f64Max_op;
    op[F64CopySign] = f64Copysign_op;
    op[I32WrapI64] = i32wrapI64_op;
    op[I32TruncF32S] = i32TruncF32S_op;
    op[I32TruncF32U] = i32TruncF32U_op;
    op[I32TruncF64S] = i32TruncF64S_op;
    op[I32TruncF64U] = i32TruncF64U_op;
    op[I64ExtendI32S] = i64ExtendI32S_op;
    op[I64ExtendI32U] = i64ExtendI32U_op;
    op[I64TruncF32S] = i64TruncF32S_op;
    op[I64TruncF32U] = i64TruncF32U_op;
    op[I64TruncF64S] = i64TruncF64S_op;
    op[I64TruncF64U] = i64TruncF64U_op;
    op[F32ConvertI32S] = f32ConvertI32S_op;
    op[F32ConvertI32U] = f32ConvertI32U_op;
    op[F32ConvertI64S] = f32ConvertI64S_op;
    op[F32ConvertI64U] = f32ConvertI64U_op;
    op[F32DemoteF64] = f32DemoteF64_op;
    op[F64ConvertI32S] = f64ConvertI32S_op;
    op[F64ConvertI32U] = f64ConvertI32U_op;
    op[F64ConvertI64S] = f64ConvertI64S_op;
    op[F64ConvertI64U] = f64ConvertI64U_op;
    op[F64PromoteF32] = f64PromoteF32_op;
    op[I32ReinterpretF32] = i32ReinterpretF32_op;
    op[I64ReinterpretF64] = i64ReinterpretF64_op;
    op[F32ReinterpretI32] = f32ReinterpretI32_op;
    op[F64ReinterpretI64] = f64ReinterpretI64_op;
    op[I32Extend8S] = i32Extend8S_op;
    op[I32Extend16S] = i32Extend16S_op;
    op[I64Extend8S] = i64Extend8S_op;
    op[I64Extend16S] = i64Extend16S_op;
    op[I64Extend32S] = i64Extend32S_op;
    op[TruncSat] = truncSat_op;
}